

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall Input::Input(Input *this)

{
  memset(this,0,0x414);
  this->mouse[0] = false;
  this->mouse[1] = false;
  this->mouse[2] = false;
  this->mouse[3] = false;
  this->mouse[4] = false;
  this->mouse[5] = false;
  this->mouse[6] = false;
  this->mouseUp[0] = false;
  *(undefined8 *)(this->mouseUp + 1) = 0;
  *(undefined8 *)(this->mouseUp + 6) = 0;
  this->mouseX = 0.0;
  this->mouseY = 0.0;
  return;
}

Assistant:

Input::Input()
{
	for (unsigned int i = 0; i< GLFW_KEY_LAST; i++)
	{
		keys[i] = false;
		keysUp[i] = false;
		keysDown[i] = false;
	}
	for (unsigned int i = 0; i< GLFW_MOUSE_BUTTON_LAST; i++)
	{
		mouse[i] = false;
		mouseUp[i] = false;
		mouseDown[i] = false;
	}
	
	mouseX = 0;
	mouseY = 0;
}